

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::JunitReporter::writeTestCase(JunitReporter *this,TestCaseNode *testCaseNode)

{
  pointer pPVar1;
  SectionNode *sectionNode;
  string local_68;
  undefined1 local_48 [8];
  string className;
  
  pPVar1 = (testCaseNode->children).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(testCaseNode->children).
            super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 == 8) {
    sectionNode = pPVar1->m_p;
    std::__cxx11::string::string
              ((string *)local_48,(string *)&(testCaseNode->value).testInfo.className);
    if ((className._M_dataplus._M_p == (pointer)0x0) &&
       ((sectionNode->childSections).
        super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (sectionNode->childSections).
        super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      std::__cxx11::string::assign(local_48);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"",(allocator<char> *)(className.field_2._M_local_buf + 0xf));
    writeSection(this,(string *)local_48,&local_68,sectionNode);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)local_48);
    return;
  }
  __assert_fail("testCaseNode.children.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/szborows[P]yebash/test/catch.hpp"
                ,0x24d7,"void Catch::JunitReporter::writeTestCase(const TestCaseNode &)");
}

Assistant:

void writeTestCase( TestCaseNode const& testCaseNode ) {
            TestCaseStats const& stats = testCaseNode.value;

            // All test cases have exactly one section - which represents the
            // test case itself. That section may have 0-n nested sections
            assert( testCaseNode.children.size() == 1 );
            SectionNode const& rootSection = *testCaseNode.children.front();

            std::string className = stats.testInfo.className;

            if( className.empty() ) {
                if( rootSection.childSections.empty() )
                    className = "global";
            }
            writeSection( className, "", rootSection );
        }